

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_map_identity
              (oonf_layer2_data *data,oonf_layer2_metadata *meta,dlep_session *session,
              uint16_t dlep_tlv,uint64_t scaling)

{
  uint16_t uVar1;
  uint32_t uVar2;
  dlep_parser_value *pdVar3;
  __uint64_t *p_Var4;
  uint8_t *dlepvalue;
  uint8_t tmp8;
  uint16_t tmp16;
  uint32_t tmp32;
  uint64_t tmp64;
  int64_t l2value;
  dlep_parser_value *value;
  uint64_t scaling_local;
  uint16_t dlep_tlv_local;
  dlep_session *session_local;
  oonf_layer2_metadata *meta_local;
  oonf_layer2_data *data_local;
  ulong local_40;
  oonf_layer2_value value_1;
  oonf_layer2_metadata *local_20;
  oonf_layer2_origin *local_18;
  oonf_layer2_data *local_10;
  
  pdVar3 = dlep_session_get_tlv_value(session,dlep_tlv);
  if (pdVar3 != (dlep_parser_value *)0x0) {
    p_Var4 = (__uint64_t *)((session->parser).tlv_ptr + pdVar3->index);
    switch(pdVar3->length) {
    case 1:
      tmp64 = (uint64_t)(char)*p_Var4;
      break;
    case 2:
      uVar1 = ntohs((uint16_t)*p_Var4);
      tmp64 = (uint64_t)(short)uVar1;
      break;
    default:
      return -1;
    case 4:
      uVar2 = ntohl((uint32_t)*p_Var4);
      tmp64 = (uint64_t)(int)uVar2;
      break;
    case 8:
      tmp64 = __bswap_64(*p_Var4);
    }
    if (meta->type == OONF_LAYER2_INTEGER_DATA) {
      oonf_layer2_data_set_int64(data,session->l2_origin,meta,tmp64,scaling);
    }
    else {
      if (meta->type != OONF_LAYER2_BOOLEAN_DATA) {
        return -1;
      }
      local_18 = session->l2_origin;
      value_1.field3[0x17] = tmp64 != 0;
      value_1.integer = 0;
      value_1._8_8_ = 0;
      local_40 = (ulong)(byte)value_1.field3[0x17];
      local_20 = meta;
      local_10 = data;
      oonf_layer2_data_set(data,local_18,meta,&local_40);
    }
  }
  return 0;
}

Assistant:

int
dlep_reader_map_identity(struct oonf_layer2_data *data, const struct oonf_layer2_metadata *meta,
  struct dlep_session *session, uint16_t dlep_tlv, uint64_t scaling) {
  struct dlep_parser_value *value;
  int64_t l2value;
  uint64_t tmp64;
  uint32_t tmp32;
  uint16_t tmp16;
  uint8_t tmp8;
  const uint8_t *dlepvalue;

  value = dlep_session_get_tlv_value(session, dlep_tlv);
  if (value) {
    dlepvalue = dlep_parser_get_tlv_binary(&session->parser, value);

    switch (value->length) {
      case 8:
        memcpy(&tmp64, dlepvalue, 8);
        l2value = (int64_t)be64toh(tmp64);
        break;
      case 4:
        memcpy(&tmp32, dlepvalue, 4);
        l2value = (int32_t)ntohl(tmp32);
        break;
      case 2:
        memcpy(&tmp16, dlepvalue, 2);
        l2value = (int16_t)ntohs(tmp16);
        break;
      case 1:
        memcpy(&tmp8, dlepvalue, 1);
        l2value = (int8_t)tmp8;
        break;
      default:
        return -1;
    }

    switch (meta->type) {
      case OONF_LAYER2_INTEGER_DATA:
        oonf_layer2_data_set_int64(data, session->l2_origin, meta, l2value, scaling);
        break;
      case OONF_LAYER2_BOOLEAN_DATA:
        oonf_layer2_data_set_bool(data, session->l2_origin, meta, l2value != 0);
        break;
      default:
        return -1;
    }
  }
  return 0;
}